

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4ccba9::InlineImageTracker::~InlineImageTracker(InlineImageTracker *this)

{
  ~InlineImageTracker(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

~InlineImageTracker() override = default;